

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_calc_hash(ptls_hash_algorithm_t *algo,void *output,void *src,size_t len)

{
  ptls_hash_context_t *ppVar1;
  int iVar2;
  
  ppVar1 = (*algo->create)();
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    (*ppVar1->update)(ppVar1,src,len);
    iVar2 = 0;
    (*ppVar1->final)(ppVar1,output,PTLS_HASH_FINAL_MODE_FREE);
  }
  return iVar2;
}

Assistant:

int ptls_calc_hash(ptls_hash_algorithm_t *algo, void *output, const void *src, size_t len)
{
    ptls_hash_context_t *ctx;

    if ((ctx = algo->create()) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->update(ctx, src, len);
    ctx->final(ctx, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}